

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O3

void __thiscall settings::~settings(settings *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  intrusive_ptr<cppcms::impl::base_cache> local_18;
  
  p_Var1 = (this->sessions).
           super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->sessions).
  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sessions).
  super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_18.p_ = (this->cache).p_;
  (this->cache).p_ = (base_cache *)0x0;
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_18);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&this->cache);
  booster::shared_object::~shared_object(&this->plugin);
  p_Var1 = (this->sessions).
           super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  cppcms::json::value::copyable::~copyable(&(this->config).d);
  pcVar2 = (this->ip)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->ip).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

~settings()
	{
		sessions.reset(); // ensure that sessions object is destroyed before shared object
		cache = 0;
	}